

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O3

BIGNUM * BN_copy(BIGNUM *a,BIGNUM *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  BIGNUM *pBVar4;
  ulong *puVar5;
  ulong *puVar6;
  uint uVar7;
  uint words;
  
  if (a != b) {
    words = b->top;
    if (a->dmax < (int)words) {
      pBVar4 = bn_expand2(a,words);
      if (pBVar4 == (BIGNUM *)0x0) {
        return (BIGNUM *)0x0;
      }
      words = b->top;
    }
    puVar5 = a->d;
    puVar6 = b->d;
    if (0 < (int)words >> 2) {
      uVar7 = ((int)words >> 2) + 1;
      do {
        uVar1 = puVar6[1];
        uVar2 = puVar6[2];
        uVar3 = puVar6[3];
        *puVar5 = *puVar6;
        puVar5[1] = uVar1;
        puVar5[2] = uVar2;
        puVar5[3] = uVar3;
        puVar5 = puVar5 + 4;
        puVar6 = puVar6 + 4;
        uVar7 = uVar7 - 1;
      } while (1 < uVar7);
    }
    switch(words & 3) {
    case 3:
      puVar5[2] = puVar6[2];
    case 2:
      puVar5[1] = puVar6[1];
    case 1:
      *puVar5 = *puVar6;
    case 0:
      a->top = words;
      a->neg = b->neg;
    }
  }
  return a;
}

Assistant:

BIGNUM *BN_copy(BIGNUM *a, const BIGNUM *b)
{
    int i;
    BN_ULONG *A;
    const BN_ULONG *B;

    bn_check_top(b);

    if (a == b)
        return (a);
    if (bn_wexpand(a, b->top) == NULL)
        return (NULL);

    A = a->d;
    B = b->d;
    for (i = b->top >> 2; i > 0; i--, A += 4, B += 4) {
        BN_ULONG a0, a1, a2, a3;
        a0 = B[0];
        a1 = B[1];
        a2 = B[2];
        a3 = B[3];
        A[0] = a0;
        A[1] = a1;
        A[2] = a2;
        A[3] = a3;
    }
    /* ultrix cc workaround, see comments in bn_expand_internal */
    switch (b->top & 3) {
    case 3:
        A[2] = B[2];
    case 2:
        A[1] = B[1];
    case 1:
        A[0] = B[0];
    case 0:;
    }

    a->top = b->top;
    a->neg = b->neg;
    bn_check_top(a);
    return (a);
}